

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O1

void PPC_init(MCRegisterInfo *MRI)

{
  uint16_t *in_RAX;
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,PPCRegDesc,0x117,0,0,PPCMCRegisterClasses,0x319b50,(uint16_t (*) [2])0x0,0x319c50,
             (MCPhysReg *)0x8,(char *)0x0,in_RAX,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void PPC_init(MCRegisterInfo *MRI)
{
	/*
	InitMCRegisterInfo(PPCRegDesc, 279, RA, PC,
			PPCMCRegisterClasses, 21,
			PPCRegUnitRoots,
			146,
			PPCRegDiffLists,
			PPCRegStrings,
			PPCSubRegIdxLists,
			8,
			PPCSubRegIdxRanges,
			PPCRegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, PPCRegDesc, 279,
			0, 0,
			PPCMCRegisterClasses, 21,
			0, 0,
			PPCRegDiffLists,
			0,
			PPCSubRegIdxLists, 8,
			0);
}